

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cpp
# Opt level: O0

void __thiscall wasm::Properties::isValidConstantExpression::Walker::~Walker(Walker *this)

{
  Walker *this_local;
  
  PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::~PostWalker
            (&this->super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>);
  return;
}

Assistant:

bool isValidConstantExpression(Module& wasm, Expression* expr) {
  struct Walker : public PostWalker<Walker, UnifiedExpressionVisitor<Walker>> {
    bool valid = true;
    void visitExpression(Expression* curr) {
      if (!isValidInConstantExpression(*getModule(), curr)) {
        valid = false;
      }
    }
  } walker;
  walker.setModule(&wasm);
  walker.walk(expr);
  return walker.valid;
}